

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::do_actual_learning_wap(ldf *data,single_learner *base,multi_ex *ec_seq)

{
  uint64_t uVar1;
  double dVar2;
  bool bVar3;
  reference ppeVar4;
  wclass *pwVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  example *in_RDI;
  uint64_t old_offset;
  float old_weight;
  float value_diff;
  v_array<COST_SENSITIVE::wclass> costs2;
  example *ec2;
  size_t k2;
  v_array<COST_SENSITIVE::wclass> costs1;
  label_data *simple_label;
  label save_cs_label;
  example *ec1;
  size_t k1;
  example **example;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> all_costs;
  size_t K;
  vector<example_*,_std::allocator<example_*>_> *in_stack_fffffffffffffe28;
  example *in_stack_fffffffffffffe30;
  value_type in_stack_fffffffffffffe38;
  vw *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  float fVar6;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
  *in_stack_fffffffffffffe78;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
  *in_stack_fffffffffffffe80;
  v_array<COST_SENSITIVE::wclass> local_118;
  value_type local_f8;
  ulong local_f0;
  v_array<COST_SENSITIVE::wclass> local_e8;
  polylabel *local_c0;
  label_t local_b8;
  wclass *pwStack_b0;
  wclass *local_a8;
  size_t sStack_a0;
  value_type local_98;
  ulong local_90;
  wclass *local_60;
  reference local_58;
  example **local_50;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_48;
  vector<example_*,_std::allocator<example_*>_> *local_40;
  size_type local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  example *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::vector
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)0x42e781
            );
  local_40 = local_18;
  local_48._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_fffffffffffffe28);
  local_50 = (example **)
             std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_fffffffffffffe28);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_fffffffffffffe30,
                            (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_fffffffffffffe28), bVar3) {
    local_58 = __gnu_cxx::
               __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
               operator*(&local_48);
    local_60 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&((*local_58)->l).simple,0);
    std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::push_back
              ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
               in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(&local_48);
  }
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  compute_wap_values((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::~vector
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             in_stack_fffffffffffffe40);
  for (local_90 = 0; local_90 < local_20; local_90 = local_90 + 1) {
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_90);
    local_98 = *ppeVar4;
    local_e8._begin = *(wclass **)&(local_98->l).multi;
    local_e8._end = (local_98->l).cs.costs._end;
    local_e8.end_array = (local_98->l).cs.costs.end_array;
    local_e8.erase_count = (local_98->l).cs.costs.erase_count;
    local_c0 = &local_98->l;
    local_b8 = (label_t)local_e8._begin;
    pwStack_b0 = local_e8._end;
    local_a8 = local_e8.end_array;
    sStack_a0 = local_e8.erase_count;
    pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_e8,0);
    if (pwVar5->class_index != 0xffffffff) {
      v_array<COST_SENSITIVE::wclass>::operator[](&local_e8,0);
      LabelDict::add_example_namespace_from_memory
                ((label_feature_map *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (size_t)in_stack_fffffffffffffe30);
      local_f0 = local_90;
      while (local_f0 = local_f0 + 1, local_f0 < local_20) {
        ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,local_f0);
        local_f8 = *ppeVar4;
        local_118._begin = *(wclass **)&(local_f8->l).multi;
        local_118._end = (local_f8->l).cs.costs._end;
        local_118.end_array = (local_f8->l).cs.costs.end_array;
        local_118.erase_count = (local_f8->l).cs.costs.erase_count;
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_118,0);
        if (pwVar5->class_index != 0xffffffff) {
          pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_118,0);
          fVar6 = pwVar5->wap_value;
          pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_e8,0);
          dVar2 = std::fabs((double)(ulong)(uint)(fVar6 - pwVar5->wap_value));
          if (1e-06 <= SUB84(dVar2,0)) {
            v_array<COST_SENSITIVE::wclass>::operator[](&local_118,0);
            LabelDict::add_example_namespace_from_memory
                      ((label_feature_map *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       (size_t)in_stack_fffffffffffffe30);
            (local_c0->simple).initial = 0.0;
            pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_e8,0);
            fVar6 = pwVar5->x;
            pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_118,0);
            (local_c0->simple).label = *(float *)(&DAT_00496220 + (ulong)(fVar6 < pwVar5->x) * 4);
            fVar6 = local_98->weight;
            local_98->weight = SUB84(dVar2,0);
            local_98->partial_prediction = 0.0;
            subtract_example(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                             in_stack_fffffffffffffe30);
            uVar1 = (local_98->super_example_predict).ft_offset;
            (local_98->super_example_predict).ft_offset =
                 (uint64_t)(local_8->super_example_predict).feature_space[2].values._begin;
            LEARNER::learner<char,_example>::learn
                      ((learner<char,_example> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
                       ,(size_t)in_stack_fffffffffffffe30);
            (local_98->super_example_predict).ft_offset = uVar1;
            local_98->weight = fVar6;
            unsubtract_example(in_stack_fffffffffffffe30);
            v_array<COST_SENSITIVE::wclass>::operator[](&local_118,0);
            LabelDict::del_example_namespace_from_memory
                      ((label_feature_map *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       (size_t)in_stack_fffffffffffffe30);
          }
        }
      }
      in_stack_fffffffffffffe30 = local_8;
      in_stack_fffffffffffffe38 = local_98;
      in_stack_fffffffffffffe40 = (vw *)v_array<COST_SENSITIVE::wclass>::operator[](&local_e8,0);
      LabelDict::del_example_namespace_from_memory
                ((label_feature_map *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (size_t)in_stack_fffffffffffffe30);
      (local_98->l).multi = local_b8;
      (local_98->l).cs.costs._end = pwStack_b0;
      (local_98->l).cs.costs.end_array = local_a8;
      (local_98->l).cs.costs.erase_count = sStack_a0;
    }
  }
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::~vector
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             in_stack_fffffffffffffe40);
  return;
}

Assistant:

void do_actual_learning_wap(ldf& data, single_learner& base, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  vector<COST_SENSITIVE::wclass*> all_costs;
  for (const auto & example : ec_seq) all_costs.push_back(&example->l.cs.costs[0]);
  compute_wap_values(all_costs);

  for (size_t k1 = 0; k1 < K; k1++)
  {
    example* ec1 = ec_seq[k1];

    // save original variables
    COST_SENSITIVE::label save_cs_label = ec1->l.cs;
    label_data& simple_label = ec1->l.simple;

    v_array<COST_SENSITIVE::wclass> costs1 = save_cs_label.costs;
    if (costs1[0].class_index == (uint32_t)-1)
      continue;

    LabelDict::add_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    for (size_t k2 = k1 + 1; k2 < K; k2++)
    {
      example* ec2 = ec_seq[k2];
      v_array<COST_SENSITIVE::wclass> costs2 = ec2->l.cs.costs;

      if (costs2[0].class_index == (uint32_t)-1)
        continue;
      float value_diff = fabs(costs2[0].wap_value - costs1[0].wap_value);
      // float value_diff = fabs(costs2[0].x - costs1[0].x);
      if (value_diff < 1e-6)
        continue;

      LabelDict::add_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);

      // learn
      simple_label.initial = 0.;
      simple_label.label = (costs1[0].x < costs2[0].x) ? -1.0f : 1.0f;
      float old_weight = ec1->weight;
      ec1->weight = value_diff;
      ec1->partial_prediction = 0.;
      subtract_example(*data.all, ec1, ec2);
      uint64_t old_offset = ec1->ft_offset;
      ec1->ft_offset = data.ft_offset;
      base.learn(*ec1);
      ec1->ft_offset = old_offset;
      ec1->weight = old_weight;
      unsubtract_example(ec1);

      LabelDict::del_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);
    }
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    // restore original cost-sensitive label, sum of importance weights
    ec1->l.cs = save_cs_label;
    // TODO: What about partial_prediction? See do_actual_learning_oaa.
  }
}